

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O1

void __thiscall sfm::FeatureSet::compute_sift(FeatureSet *this,ConstPtr *image)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pDVar3;
  undefined1 __first [8];
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 local_f0 [8];
  Sift sift;
  ConstPtr local_58;
  undefined1 auStack_48 [8];
  Descriptors descr;
  
  auStack_48 = (undefined1  [8])0x0;
  descr.super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descr.super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  features::Sift::Sift((Sift *)local_f0,&(this->opts).sift_opts);
  local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_58.
            super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  features::Sift::set_image((Sift *)local_f0,&local_58);
  if (local_58.super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  features::Sift::process((Sift *)local_f0);
  std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::operator=
            ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             auStack_48,
             (vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             &sift.keypoints.
              super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sift.keypoints.
      super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(sift.keypoints.
                    super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (sift.octaves.
      super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(sift.octaves.
                    super__Vector_base<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::~vector
            ((vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_> *)
             &sift.orig.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (sift.orig.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sift.orig.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  pDVar1 = descr.
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __first = auStack_48;
  if (auStack_48 !=
      (undefined1  [8])
      descr.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar4 = ((long)descr.
                   super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4) *
            0xf83e0f83e0f83e1;
    lVar6 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<features::Sift::Descriptor*,std::vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(features::Sift::Descriptor_const&,features::Sift::Descriptor_const&)>>
              ((__normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
                )auStack_48,
               (__normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
                )descr.
                 super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_start,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_features::Sift::Descriptor_&,_const_features::Sift::Descriptor_&)>
                )0x10bf8f);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<features::Sift::Descriptor*,std::vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(features::Sift::Descriptor_const&,features::Sift::Descriptor_const&)>>
              ((__normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
                )__first,
               (__normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
                )pDVar1,(_Iter_comp_iter<bool_(*)(const_features::Sift::Descriptor_&,_const_features::Sift::Descriptor_&)>
                         )0x10bf8f);
  }
  sift.descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->positions;
  lVar6 = (long)(this->positions).
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->positions).
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::resize
            ((vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
             sift.descriptors.
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             ((long)descr.
                    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4) *
             0xf83e0f83e0f83e1 + lVar6);
  std::vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>::
  resize(&this->colors,
         ((long)descr.
                super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >> 4) *
         0xf83e0f83e0f83e1 + lVar6);
  if ((undefined1  [8])
      descr.
      super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_start != auStack_48) {
    lVar5 = lVar6 * 3;
    lVar7 = 4;
    uVar4 = 0;
    do {
      *(undefined8 *)
       (*(long *)sift.descriptors.
                 super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar6 * 8 + uVar4 * 8) =
           *(undefined8 *)
            ((long)((Vector<float,_128> *)((long)auStack_48 + 0x10))->v + lVar7 + -0x14);
      core::Image<unsigned_char>::linear_at
                ((image->
                 super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,*(float *)((long)((Vector<float,_128> *)((long)auStack_48 + 0x10))->v +
                                  lVar7 + -0x14),
                 *(float *)((long)((Vector<float,_128> *)((long)auStack_48 + 0x10))->v +
                           lVar7 + -0x10),
                 ((this->colors).
                  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->v + lVar5);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 3;
      lVar7 = lVar7 + 0x210;
    } while (uVar4 < (ulong)(((long)descr.
                                    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48 >>
                             4) * 0xf83e0f83e0f83e1));
  }
  pDVar1 = (this->sift_descriptors).
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->sift_descriptors).
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar3 = (this->sift_descriptors).
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->sift_descriptors).
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
  (this->sift_descriptors).
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       descr.
       super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->sift_descriptors).
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       descr.
       super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar1 != (pointer)0x0) {
    auStack_48 = (undefined1  [8])pDVar1;
    descr.
    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_start = pDVar2;
    descr.
    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar3;
    operator_delete(pDVar1);
  }
  return;
}

Assistant:

void
FeatureSet::compute_sift (core::ByteImage::ConstPtr image)
{
    /* Compute features. */
    Sift::Descriptors descr;
    {
        Sift sift(this->opts.sift_opts);
        sift.set_image(image);
        sift.process();
        descr = sift.get_descriptors();
    }

    /* Sort features by scale for low-res matching. */
    std::sort(descr.begin(), descr.end(), compare_scale<sfm::Sift::Descriptor>);

    /* Prepare and copy to data structures. */
    std::size_t offset = this->positions.size();
    this->positions.resize(offset + descr.size());
    this->colors.resize(offset + descr.size());

    for (std::size_t i = 0; i < descr.size(); ++i)
    {
        Sift::Descriptor const& d = descr[i];
        this->positions[offset + i] = math::Vec2f(d.x, d.y);
        image->linear_at(d.x, d.y, this->colors[offset + i].begin());
    }

    /* Keep SIFT descriptors. */
    std::swap(descr, this->sift_descriptors);
}